

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_utils.h
# Opt level: O2

void __thiscall
HandleInfoBase<XrAction_T_*,_GenValidUsageXrHandleInfo>::erase
          (HandleInfoBase<XrAction_T_*,_GenValidUsageXrHandleInfo> *this,XrAction_T *handle)

{
  iterator iVar1;
  UniqueLock lock;
  allocator local_41;
  XrAction_T *local_40;
  unique_lock<std::mutex> local_38;
  string local_28;
  
  local_40 = handle;
  if (handle == (XrAction_T *)0x0) {
    std::__cxx11::string::string
              ((string *)&local_28,"Null handle passed to HandleInfoBase::erase()",
               (allocator *)&local_38);
    reportInternalError(&local_28);
  }
  std::unique_lock<std::mutex>::unique_lock(&local_38,&this->dispatch_mutex_);
  iVar1 = std::
          _Hashtable<XrAction_T_*,_std::pair<XrAction_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_std::allocator<std::pair<XrAction_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<XrAction_T_*>,_std::hash<XrAction_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<XrAction_T_*,_std::pair<XrAction_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_std::allocator<std::pair<XrAction_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<XrAction_T_*>,_std::hash<XrAction_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this,&local_40);
  if (iVar1.
      super__Node_iterator_base<std::pair<XrAction_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    std::
    _Hashtable<XrAction_T_*,_std::pair<XrAction_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_std::allocator<std::pair<XrAction_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<XrAction_T_*>,_std::hash<XrAction_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase((_Hashtable<XrAction_T_*,_std::pair<XrAction_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_std::allocator<std::pair<XrAction_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<XrAction_T_*>,_std::hash<XrAction_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)this,&local_40);
    std::unique_lock<std::mutex>::~unique_lock(&local_38);
    return;
  }
  std::__cxx11::string::string
            ((string *)&local_28,"Handle passed to HandleInfoBase::insert() not inserted",&local_41)
  ;
  reportInternalError(&local_28);
}

Assistant:

inline void HandleInfoBase<HandleType, InfoType>::erase(HandleType handle) {
    if (handle == XR_NULL_HANDLE) {
        reportInternalError("Null handle passed to HandleInfoBase::erase()");
    }
    UniqueLock lock(dispatch_mutex_);
    auto entry_returned = info_map_.find(handle);
    if (entry_returned == info_map_.end()) {
        reportInternalError("Handle passed to HandleInfoBase::insert() not inserted");
    }
    info_map_.erase(handle);
}